

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O2

OutStream * __thiscall
r_comp::OutStream::insert<std::__cxx11::string>
          (OutStream *this,uint64_t index,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  vector<std::fpos<__mbstate_t>_> *this_00;
  ostringstream *poVar1;
  long lVar2;
  unsigned_short *puVar3;
  fpos<__mbstate_t> *pfVar4;
  long lVar5;
  ulong i;
  string asStack_68 [32];
  string s;
  
  puVar3 = r_code::vector<unsigned_short>::operator[](&this->code_indexes_to_stream_indexes,index);
  i = (ulong)*puVar3;
  poVar1 = this->stream;
  this_00 = &this->positions;
  pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i);
  std::ostream::seekp(poVar1,pfVar4->_M_off,pfVar4->_M_state);
  std::__cxx11::stringbuf::str();
  r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i);
  std::__cxx11::string::substr((ulong)&s,(ulong)asStack_68);
  std::__cxx11::string::~string(asStack_68);
  std::operator<<((ostream *)this->stream,(string *)t);
  lVar5 = std::ostream::tellp();
  pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i);
  lVar2 = pfVar4->_M_off;
  std::operator<<((ostream *)this->stream,(string *)&s);
  while (i = (ulong)((int)i + 1U & 0xffff),
        i < (ulong)((long)(this->positions).m_vector.
                          super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->positions).m_vector.
                          super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i);
    pfVar4->_M_off = pfVar4->_M_off + (lVar5 - lVar2);
  }
  std::__cxx11::string::~string((string *)&s);
  return this;
}

Assistant:

OutStream &insert(uint64_t index, const T &t)   // inserts before code_indexes_to_stream_indexes[index]
    {
        uint16_t stream_index = code_indexes_to_stream_indexes[index];
        stream->seekp(positions[stream_index]);
        std::string s = stream->str().substr(positions[stream_index]);
        *stream << t;
        std::streamoff offset = stream->tellp() - positions[stream_index];
        *stream << s;

        for (uint16_t i = stream_index + 1; i < positions.size(); ++i) { // right-shift
            positions[i] += offset;
        }

        return *this;
    }